

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
Kumu::operator<<(basic_ostream<char,_std::char_traits<char>_> *strm,LogEntry *Entry)

{
  string buf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string local_1d0;
  string local_1b0 [32];
  long local_190 [2];
  undefined8 auStack_180 [45];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ios::copyfmt((ios *)((ostringstream *)local_190 + *(long *)(local_190[0] + -0x18)));
  *(undefined8 *)((long)auStack_180 + *(long *)(local_190[0] + -0x18)) = 0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  LogEntry::CreateStringWithOptions(Entry,&local_1d0,-0x100000);
  std::operator<<((ostream *)local_190,(string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)strm,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return strm;
}

Assistant:

std::basic_ostream<char, std::char_traits<char> >&
Kumu::operator<<(std::basic_ostream<char, std::char_traits<char> >& strm, LogEntry const& Entry)
{
  std::basic_ostringstream<char, std::char_traits<char> > s;
  s.copyfmt(strm);
  s.width(0);
  std::string buf;

  s << Entry.CreateStringWithOptions(buf, LOG_OPTION_ALL);

  strm << s.str();
  return strm;
}